

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> __thiscall
kj::anon_unknown_30::SocketAddress::lookupHost
          (SocketAddress *this,LowLevelAsyncIoProvider *lowLevel,String *host,String *service,
          uint portHint,NetworkFilter *filter)

{
  int osErrorNumber;
  void *pvVar1;
  String *pSVar2;
  Own<kj::Thread> *params_00;
  Own<kj::AsyncInputStream> *params_1;
  LookupReader *pLVar3;
  Type *func;
  void *__buf;
  PromiseNode *extraout_RDX;
  Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> PVar4;
  undefined1 local_120 [16];
  undefined1 local_110 [8];
  Own<kj::(anonymous_namespace)::SocketAddress::LookupReader> reader;
  CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_unix_c__:896:52),_kj::(anonymous_namespace)::SocketAddress::LookupParams>
  local_f8;
  undefined1 local_c0 [8];
  Own<kj::Thread> thread;
  LookupParams params;
  undefined1 local_78 [4];
  int outFd;
  Own<kj::AsyncInputStream> input;
  Fault local_58;
  Fault f;
  SyscallResult local_44;
  undefined1 local_40 [4];
  SyscallResult _kjSyscallResult;
  int fds [2];
  NetworkFilter *filter_local;
  uint portHint_local;
  String *service_local;
  String *host_local;
  LowLevelAsyncIoProvider *lowLevel_local;
  
  f.exception = (Exception *)local_40;
  local_44 = _::Debug::
             syscall<kj::(anonymous_namespace)::SocketAddress::lookupHost(kj::LowLevelAsyncIoProvider&,kj::String,kj::String,unsigned_int,kj::_::NetworkFilter&)::__0>
                       ((anon_class_8_1_ba1d46d5 *)&f,false);
  pvVar1 = _::Debug::SyscallResult::operator_cast_to_void_(&local_44);
  if (pvVar1 != (void *)0x0) {
    func = (Type *)0x7;
    (**lowLevel->_vptr_LowLevelAsyncIoProvider)(local_78,lowLevel,(ulong)(uint)local_40);
    params.service.content.disposer._4_4_ = _kjSyscallResult.errorNumber;
    pSVar2 = mv<kj::String>(host);
    String::String((String *)&thread.ptr,pSVar2);
    pSVar2 = mv<kj::String>(service);
    String::String((String *)&params.host.content.disposer,pSVar2);
    reader.ptr._0_4_ = params.service.content.disposer._4_4_;
    reader.ptr._4_4_ = portHint;
    mvCapture<kj::(anonymous_namespace)::SocketAddress::lookupHost(kj::LowLevelAsyncIoProvider&,kj::String,kj::String,unsigned_int,kj::_::NetworkFilter&)::__1,kj::(anonymous_namespace)::SocketAddress::LookupParams&>
              (&local_f8,(kj *)&thread.ptr,(LookupParams *)&reader.ptr,func);
    heap<kj::Thread,kj::CaptureByMove<kj::(anonymous_namespace)::SocketAddress::lookupHost(kj::LowLevelAsyncIoProvider&,kj::String,kj::String,unsigned_int,kj::_::NetworkFilter&)::__1,kj::(anonymous_namespace)::SocketAddress::LookupParams>>
              ((kj *)local_c0,&local_f8);
    CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++:896:52),_kj::(anonymous_namespace)::SocketAddress::LookupParams>
    ::~CaptureByMove(&local_f8);
    params_00 = mv<kj::Own<kj::Thread>>((Own<kj::Thread> *)local_c0);
    params_1 = mv<kj::Own<kj::AsyncInputStream>>((Own<kj::AsyncInputStream> *)local_78);
    heap<kj::(anonymous_namespace)::SocketAddress::LookupReader,kj::Own<kj::Thread>,kj::Own<kj::AsyncInputStream>,kj::_::NetworkFilter&>
              ((kj *)local_110,params_00,params_1,filter);
    pLVar3 = Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>::operator->
                       ((Own<kj::(anonymous_namespace)::SocketAddress::LookupReader> *)local_110);
    LookupReader::read((LookupReader *)local_120,(int)pLVar3,__buf,(size_t)filter);
    mv<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>>
              ((Own<kj::(anonymous_namespace)::SocketAddress::LookupReader> *)local_110);
    Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>>::
    attach<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>>
              ((Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>> *)this,
               (Own<kj::(anonymous_namespace)::SocketAddress::LookupReader> *)local_120);
    Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::~Promise
              ((Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)local_120);
    Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>::~Own
              ((Own<kj::(anonymous_namespace)::SocketAddress::LookupReader> *)local_110);
    Own<kj::Thread>::~Own((Own<kj::Thread> *)local_c0);
    LookupParams::~LookupParams((LookupParams *)&thread.ptr);
    Own<kj::AsyncInputStream>::~Own((Own<kj::AsyncInputStream> *)local_78);
    PVar4.super_PromiseBase.node.ptr = extraout_RDX;
    PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
    return (Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>)
           PVar4.super_PromiseBase.node;
  }
  osErrorNumber = _::Debug::SyscallResult::getErrorNumber(&local_44);
  _::Debug::Fault::Fault
            (&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x375,osErrorNumber,"pipe2(fds, O_NONBLOCK | O_CLOEXEC)","");
  _::Debug::Fault::fatal(&local_58);
}

Assistant:

Promise<Array<SocketAddress>> SocketAddress::lookupHost(
    LowLevelAsyncIoProvider& lowLevel, kj::String host, kj::String service, uint portHint,
    _::NetworkFilter& filter) {
  // This shitty function spawns a thread to run getaddrinfo().  Unfortunately, getaddrinfo() is
  // the only cross-platform DNS API and it is blocking.
  //
  // TODO(perf):  Use a thread pool?  Maybe kj::Thread should use a thread pool automatically?
  //   Maybe use the various platform-specific asynchronous DNS libraries?  Please do not implement
  //   a custom DNS resolver...

  int fds[2];
#if __linux__ && !__BIONIC__
  KJ_SYSCALL(pipe2(fds, O_NONBLOCK | O_CLOEXEC));
#else
  KJ_SYSCALL(pipe(fds));
#endif

  auto input = lowLevel.wrapInputFd(fds[0], NEW_FD_FLAGS);

  int outFd = fds[1];

  LookupParams params = { kj::mv(host), kj::mv(service) };

  auto thread = heap<Thread>(kj::mvCapture(params, [outFd,portHint](LookupParams&& params) {
    FdOutputStream output((AutoCloseFd(outFd)));

    struct addrinfo* list;
    int status = getaddrinfo(
        params.host == "*" ? nullptr : params.host.cStr(),
        params.service == nullptr ? nullptr : params.service.cStr(),
        nullptr, &list);
    if (status == 0) {
      KJ_DEFER(freeaddrinfo(list));

      struct addrinfo* cur = list;
      while (cur != nullptr) {
        if (params.service == nullptr) {
          switch (cur->ai_addr->sa_family) {
            case AF_INET:
              ((struct sockaddr_in*)cur->ai_addr)->sin_port = htons(portHint);
              break;
            case AF_INET6:
              ((struct sockaddr_in6*)cur->ai_addr)->sin6_port = htons(portHint);
              break;
            default:
              break;
          }
        }

        SocketAddress addr;
        if (params.host == "*") {
          // Set up a wildcard SocketAddress.  Only use the port number returned by getaddrinfo().
          addr.wildcard = true;
          addr.addrlen = sizeof(addr.addr.inet6);
          addr.addr.inet6.sin6_family = AF_INET6;
          switch (cur->ai_addr->sa_family) {
            case AF_INET:
              addr.addr.inet6.sin6_port = ((struct sockaddr_in*)cur->ai_addr)->sin_port;
              break;
            case AF_INET6:
              addr.addr.inet6.sin6_port = ((struct sockaddr_in6*)cur->ai_addr)->sin6_port;
              break;
            default:
              addr.addr.inet6.sin6_port = portHint;
              break;
          }
        } else {
          addr.addrlen = cur->ai_addrlen;
          memcpy(&addr.addr.generic, cur->ai_addr, cur->ai_addrlen);
        }
        KJ_ASSERT_CAN_MEMCPY(SocketAddress);
        output.write(&addr, sizeof(addr));
        cur = cur->ai_next;
      }
    } else if (status == EAI_SYSTEM) {
      KJ_FAIL_SYSCALL("getaddrinfo", errno, params.host, params.service) {
        return;
      }
    } else {
      KJ_FAIL_REQUIRE("DNS lookup failed.",
                      params.host, params.service, gai_strerror(status)) {
        return;
      }
    }
  }));

  auto reader = heap<LookupReader>(kj::mv(thread), kj::mv(input), filter);
  return reader->read().attach(kj::mv(reader));
}